

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall capnp::_::PointerBuilder::transferFrom(PointerBuilder *this,PointerBuilder other)

{
  bool bVar1;
  PointerBuilder *this_local;
  
  bVar1 = WirePointer::isNull(this->pointer);
  if (!bVar1) {
    WireHelpers::zeroObject(this->segment,this->capTable,this->pointer);
    WireHelpers::zeroMemory(this->pointer);
  }
  WireHelpers::transferPointer(this->segment,this->pointer,other.segment,other.pointer);
  WireHelpers::zeroMemory(other.pointer);
  return;
}

Assistant:

void PointerBuilder::transferFrom(PointerBuilder other) {
  if (!pointer->isNull()) {
    WireHelpers::zeroObject(segment, capTable, pointer);
    WireHelpers::zeroMemory(pointer);
  }
  WireHelpers::transferPointer(segment, pointer, other.segment, other.pointer);
  WireHelpers::zeroMemory(other.pointer);
}